

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

shared_ptr<kratos::PortBundleRef> __thiscall
kratos::Generator::add_bundle_port_def(Generator *this,string *port_name,PortBundleDefinition *def)

{
  Var *pVVar1;
  bool bVar2;
  UserException *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_>_>
  *pmVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  *this_01;
  reference __in;
  type *var_name_00;
  type *__t;
  __tuple_element_t<0UL,_tuple<unsigned_int,_unsigned_int,_bool,_PortDirection,_PortType>_> *p_Var4;
  __tuple_element_t<1UL,_tuple<unsigned_int,_unsigned_int,_bool,_PortDirection,_PortType>_> *p_Var5;
  __tuple_element_t<2UL,_tuple<unsigned_int,_unsigned_int,_bool,_PortDirection,_PortType>_> *p_Var6;
  __tuple_element_t<3UL,_tuple<unsigned_int,_unsigned_int,_bool,_PortDirection,_PortType>_> *p_Var7;
  element_type *this_02;
  mapped_type *__args;
  PortBundleDefinition *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  remove_reference_t<std::__cxx11::basic_string<char>_&> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  shared_ptr<kratos::PortBundleRef> sVar8;
  string_view format_str;
  format_args args;
  bool local_229;
  _Self local_1d8;
  _Self local_1d0;
  Port *local_1c8;
  Port *p;
  string var_name;
  type *port_type;
  type *direction;
  type *is_signed;
  type *size;
  type *width;
  type *bundle;
  type *name_;
  _Self local_158;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_>_>
  *__range1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  *debug_info;
  undefined1 local_129;
  undefined1 local_128 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_>_>
  definition;
  string local_e8;
  _Self local_c8;
  _Self local_c0;
  PortBundleDefinition *local_b8;
  PortBundleDefinition *def_local;
  string *port_name_local;
  Generator *this_local;
  shared_ptr<kratos::PortBundleRef> *ref;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_90;
  basic_string_view<char> local_88;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_58;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  PortBundleDefinition *local_48;
  char *local_40;
  string *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  local_b8 = in_RCX;
  def_local = def;
  port_name_local = port_name;
  this_local = this;
  local_c0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::PortBundleRef>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::PortBundleRef>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::PortBundleRef>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::PortBundleRef>_>_>_>
               *)&port_name[0xe]._M_string_length,&def->name_);
  local_c8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::PortBundleRef>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::PortBundleRef>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::PortBundleRef>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::PortBundleRef>_>_>_>
              *)&port_name[0xe]._M_string_length);
  bVar2 = std::operator!=(&local_c0,&local_c8);
  if (!bVar2) {
    pmVar3 = PortBundleDefinition::definition_abi_cxx11_(local_b8);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_>_>
           *)local_128,pmVar3);
    local_129 = 0;
    debug_info = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                  *)port_name;
    std::make_shared<kratos::PortBundleRef,kratos::Generator*,kratos::PortBundleDefinition_const&>
              ((Generator **)this,(PortBundleDefinition *)&debug_info);
    this_01 = PortBundleDefinition::debug_info_abi_cxx11_(local_b8);
    __end1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_>_>
             ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_>_>
                      *)local_128);
    local_158._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_>_>
                *)local_128);
    while (bVar2 = std::operator!=(&__end1,&local_158), bVar2) {
      __in = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_>
             ::operator*(&__end1);
      var_name_00 = std::
                    get<0ul,std::__cxx11::string_const,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>>
                              (__in);
      __t = std::
            get<1ul,std::__cxx11::string_const,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>>
                      (__in);
      p_Var4 = std::get<0ul,unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>
                         (__t);
      p_Var5 = std::get<1ul,unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>
                         (__t);
      p_Var6 = std::get<2ul,unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>
                         (__t);
      p_Var7 = std::get<3ul,unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>
                         (__t);
      var_name.field_2._8_8_ =
           std::get<4ul,unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>(__t);
      get_unique_variable_name((string *)&p,(Generator *)port_name,&def_local->name_,var_name_00);
      local_1c8 = port((Generator *)port_name,*p_Var7,(string *)&p,*p_Var4,*p_Var5,
                       *(PortType *)var_name.field_2._8_8_,(bool)(*p_Var6 & 1));
      this_02 = std::
                __shared_ptr_access<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
      PortBundleRef::add_name_mapping(this_02,var_name_00,(string *)&p);
      local_229 = false;
      if ((port_name[5].field_2._M_local_buf[0xc] & 1U) != 0) {
        local_1d0._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
             ::find(this_01,var_name_00);
        local_1d8._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
             ::end(this_01);
        local_229 = std::operator!=(&local_1d0,&local_1d8);
      }
      if (local_229 != false) {
        pVVar1 = &local_1c8->super_Var;
        __args = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                 ::at(this_01,var_name_00);
        std::
        vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
        ::emplace_back<std::pair<std::__cxx11::string,unsigned_int>const&>
                  ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                    *)&(pVVar1->super_IRNode).fn_name_ln,__args);
      }
      std::__cxx11::string::~string((string *)&p);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_>
      ::operator++(&__end1);
    }
    std::
    map<std::__cxx11::string,std::shared_ptr<kratos::PortBundleRef>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::PortBundleRef>>>>
    ::emplace<std::__cxx11::string_const&,std::shared_ptr<kratos::PortBundleRef>&>
              ((map<std::__cxx11::string,std::shared_ptr<kratos::PortBundleRef>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::PortBundleRef>>>>
                *)&port_name[0xe]._M_string_length,&def_local->name_,
               (shared_ptr<kratos::PortBundleRef> *)this);
    local_129 = 1;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_>_>
            *)local_128);
    sVar8.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar8.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<kratos::PortBundleRef>)
           sVar8.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>;
  }
  definition._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ = 1;
  this_00 = (UserException *)__cxa_allocate_exception(0x10);
  vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)((long)&port_name[3].field_2 + 8);
  local_38 = &local_e8;
  local_40 = "{0} already exists in {1}";
  local_48 = def_local;
  fmt::v7::make_args_checked<std::__cxx11::string_const&,std::__cxx11::string&,char[26],char>
            (&local_78,(v7 *)0x41d11e,(char (*) [26])def_local,
             (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)vargs,in_R8);
  local_58 = &local_78;
  local_88 = fmt::v7::to_string_view<char,_0>(local_40);
  local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              *)&ref;
  local_30 = local_58;
  local_20 = local_58;
  local_10 = local_58;
  local_18 = local_28;
  fmt::v7::
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(local_28,0xdd,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)local_58);
  format_str.size_ = (size_t)ref;
  format_str.data_ = (char *)local_88.size_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_90.values_;
  fmt::v7::detail::vformat_abi_cxx11_(&local_e8,(detail *)local_88.data_,format_str,args);
  UserException::UserException(this_00,&local_e8);
  definition._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ = 0;
  __cxa_throw(this_00,&UserException::typeinfo,UserException::~UserException);
}

Assistant:

std::shared_ptr<PortBundleRef> Generator::add_bundle_port_def(const std::string &port_name,
                                                              const PortBundleDefinition &def) {
    if (port_bundle_mapping_.find(port_name) != port_bundle_mapping_.end())
        throw UserException(::format("{0} already exists in {1}", port_name, name));
    auto definition = def.definition();
    auto ref = std::make_shared<PortBundleRef>(this, def);
    auto const &debug_info = def.debug_info();
    for (auto const &[name_, bundle] : definition) {
        auto const &[width, size, is_signed, direction, port_type] = bundle;
        auto var_name = get_unique_variable_name(port_name, name_);
        auto &p = port(direction, var_name, width, size, port_type, is_signed);
        // add to the ref mapping as well
        ref->add_name_mapping(name_, var_name);
        if (debug && debug_info.find(name_) != debug_info.end()) {
            p.fn_name_ln.emplace_back(debug_info.at(name_));
        }
    }
    // add to the bundle mapping
    port_bundle_mapping_.emplace(port_name, ref);

    return ref;
}